

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O0

void __thiscall
TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::TPZVec
          (TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,int64_t size)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong *puVar3;
  string *psVar4;
  ulong in_RSI;
  undefined8 *in_RDI;
  ulong uVar5;
  string *local_30;
  
  *in_RDI = &PTR__TPZVec_023db338;
  in_RDI[1] = 0;
  if ((long)in_RSI < 0) {
    std::operator<<((ostream *)&std::cerr,
                    "TPZVec<std::basic_string<char>>::TPZVec(const int64_t) [T = std::basic_string<char>]"
                   );
    std::operator<<((ostream *)&std::cerr,"Bad parameter size, then size = 0.\n");
    std::ostream::flush();
    in_RDI[2] = 0;
    in_RDI[3] = 0;
  }
  else {
    if (0 < (long)in_RSI) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = in_RSI;
      uVar2 = SUB168(auVar1 * ZEXT816(0x20),0);
      uVar5 = uVar2 + 8;
      if (SUB168(auVar1 * ZEXT816(0x20),8) != 0 || 0xfffffffffffffff7 < uVar2) {
        uVar5 = 0xffffffffffffffff;
      }
      puVar3 = (ulong *)operator_new__(uVar5);
      *puVar3 = in_RSI;
      psVar4 = (string *)(puVar3 + 1);
      if (in_RSI != 0) {
        local_30 = psVar4;
        do {
          std::__cxx11::string::string(local_30);
          local_30 = local_30 + 0x20;
        } while (local_30 != psVar4 + in_RSI * 0x20);
      }
      in_RDI[1] = psVar4;
    }
    in_RDI[2] = in_RSI;
    in_RDI[3] = in_RSI;
  }
  return;
}

Assistant:

TPZVec<T>::TPZVec( const int64_t size ) : fStore( nullptr )
{
#ifndef PZNODEBUG
	if( size < 0 )
	{
		PZError << __PRETTY_FUNCTION__;
        PZError << "Bad parameter size, then size = 0.\n";
		PZError.flush();
		fNElements = 0;
        fNAlloc = 0;
		return;
	}
#endif
	
	// If a positive value was requested, allocate it.
	if( size > 0 )
	{
		fStore = new T[ size ];
	}
	
	// Note that even 0 sized vectors are allowed.
	fNElements = size;
    fNAlloc = size;
    
}